

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

vector<pbrt::Shape,_pstd::pmr::polymorphic_allocator<pbrt::Shape>_> *
pbrt::Triangle::CreateTriangles(TriangleMesh *mesh,Allocator alloc)

{
  unsigned_long *args_3;
  vector<pbrt::Shape,_pstd::pmr::polymorphic_allocator<pbrt::Shape>_> *this;
  int *in_RDX;
  char (*in_RSI) [8];
  vector<pbrt::Shape,_pstd::pmr::polymorphic_allocator<pbrt::Shape>_> *in_RDI;
  long *in_FS_OFFSET;
  int i;
  Triangle *t;
  int meshIndex;
  int vb;
  size_t va;
  vector<pbrt::Shape,_pstd::pmr::polymorphic_allocator<pbrt::Shape>_> *tris;
  Triangle *in_stack_ffffffffffffff48;
  mutex *in_stack_ffffffffffffff50;
  Triangle *in_stack_ffffffffffffff58;
  vector<const_pbrt::TriangleMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::TriangleMesh_*>_>
  *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  vector<pbrt::Shape,_pstd::pmr::polymorphic_allocator<pbrt::Shape>_> *args_1;
  char (*in_stack_ffffffffffffffa0) [18];
  undefined4 in_stack_ffffffffffffffa8;
  int iVar1;
  undefined4 in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  LogLevel in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  
  args_1 = in_RDI;
  std::mutex::lock(in_stack_ffffffffffffff50);
  args_3 = (unsigned_long *)
           pstd::
           vector<const_pbrt::TriangleMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::TriangleMesh_*>_>
           ::size(allMeshes);
  if (args_3 < (unsigned_long *)0xffffffff80000000) {
    pstd::
    vector<const_pbrt::TriangleMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::TriangleMesh_*>_>
    ::size(allMeshes);
    pstd::
    vector<const_pbrt::TriangleMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::TriangleMesh_*>_>
    ::push_back(in_stack_ffffffffffffff60,(TriangleMesh **)in_stack_ffffffffffffff58);
    std::mutex::unlock((mutex *)0x570946);
    this = (vector<pbrt::Shape,_pstd::pmr::polymorphic_allocator<pbrt::Shape>_> *)
           (long)*(int *)*in_RSI;
    pstd::pmr::polymorphic_allocator<pbrt::Shape>::polymorphic_allocator<std::byte>
              ((polymorphic_allocator<pbrt::Shape> *)in_stack_ffffffffffffff50,
               (polymorphic_allocator<std::byte> *)in_stack_ffffffffffffff48);
    pstd::vector<pbrt::Shape,_pstd::pmr::polymorphic_allocator<pbrt::Shape>_>::vector
              (this,in_stack_ffffffffffffff68,
               (polymorphic_allocator<pbrt::Shape> *)in_stack_ffffffffffffff60);
    pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<pbrt::Triangle>
              ((polymorphic_allocator<std::byte> *)in_stack_ffffffffffffff50,
               (size_t)in_stack_ffffffffffffff48);
    for (iVar1 = 0; iVar1 < *(int *)*in_RSI; iVar1 = iVar1 + 1) {
      pstd::pmr::polymorphic_allocator<std::byte>::construct<pbrt::Triangle,int&,int&>
                ((polymorphic_allocator<std::byte> *)in_stack_ffffffffffffff60,
                 in_stack_ffffffffffffff58,(int *)in_stack_ffffffffffffff50,
                 &in_stack_ffffffffffffff48->meshIndex);
      Shape::TaggedPointer<pbrt::Triangle>
                ((Shape *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      pstd::vector<pbrt::Shape,_pstd::pmr::polymorphic_allocator<pbrt::Shape>_>::operator[]
                (in_RDI,(long)iVar1);
      Shape::operator=((Shape *)in_stack_ffffffffffffff50,(Shape *)in_stack_ffffffffffffff48);
    }
    *(long *)(*in_FS_OFFSET + -0x570) =
         (long)*(int *)*in_RSI * 8 + *(long *)(*in_FS_OFFSET + -0x570);
    return args_1;
  }
  LogFatal<char_const(&)[18],char_const(&)[8],char_const(&)[18],unsigned_long&,char_const(&)[8],int&>
            (in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
             (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             in_stack_ffffffffffffffa0,(char (*) [8])args_1,
             (char (*) [18])CONCAT44(0x80000000,in_stack_ffffffffffffffd0),args_3,in_RSI,in_RDX);
}

Assistant:

pstd::vector<Shape> Triangle::CreateTriangles(const TriangleMesh *mesh, Allocator alloc) {
    static std::mutex allMeshesLock;
    allMeshesLock.lock();
    CHECK_LT(allMeshes->size(), 1 << 31);
    int meshIndex = int(allMeshes->size());
    allMeshes->push_back(mesh);
    allMeshesLock.unlock();

    pstd::vector<Shape> tris(mesh->nTriangles, alloc);
    Triangle *t = alloc.allocate_object<Triangle>(mesh->nTriangles);
    for (int i = 0; i < mesh->nTriangles; ++i) {
        alloc.construct(&t[i], meshIndex, i);
        tris[i] = &t[i];
    }
    triangleBytes += mesh->nTriangles * sizeof(Triangle);
    return tris;
}